

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL Js::JavascriptArray::GetIndex(char16 *propName,uint32 *pIndex)

{
  ushort *puVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  sVar3 = PAL_wcslen(propName);
  uVar4 = (ushort)*propName - 0x30;
  uVar2 = 0;
  if (uVar4 < 10) {
    if (uVar4 == 0) {
      *pIndex = 0;
      uVar2 = (uint)((int)sVar3 == 1);
    }
    else {
      lVar5 = 2;
      do {
        puVar1 = (ushort *)((long)propName + lVar5);
        uVar6 = *puVar1 - 0x30;
        if (9 < uVar6) {
          if (uVar4 == 0xffffffff) {
            return 0;
          }
          if (lVar5 >> 1 != (long)(int)sVar3) {
            return 0;
          }
          *pIndex = uVar4;
          return 1;
        }
        if (0x19999999 < uVar4) {
          return 0;
        }
        uVar7 = uVar4 * 10;
        uVar4 = uVar6 + uVar7;
        lVar5 = lVar5 + 2;
      } while (uVar7 <= 0x2f - *puVar1);
    }
  }
  return uVar2;
}

Assistant:

BOOL JavascriptArray::GetIndex(const char16* propName, uint32 *pIndex)
    {
        uint32 lu, luDig;

        int32 cch = (int32)wcslen(propName);
        char16* pch = const_cast<char16 *>(propName);

        lu = *pch - '0';
        if (lu > 9)
            return FALSE;

        if (0 == lu)
        {
            *pIndex = 0;
            return 1 == cch;
        }

        while ((luDig = *++pch - '0') < 10)
        {
            // If we overflow 32 bits, ignore the item
            if (lu > 0x19999999)
                return FALSE;
            lu *= 10;
            if(lu > (ULONG_MAX - luDig))
                return FALSE;
            lu += luDig;
        }

        if (pch - propName != cch)
            return FALSE;

        if (lu == JavascriptArray::InvalidIndex)
        {
            // 0xFFFFFFFF is not treated as an array index so that the length can be
            // capped at 32 bits.
            return FALSE;
        }

        *pIndex = lu;
        return TRUE;
    }